

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_cookmem_3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  duration<double,_std::ratio<1L,_1L>_> local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<double,_std::ratio<1L,_1L>_> local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point t3;
  time_point t2;
  time_point t1;
  char **argv_local;
  int argc_local;
  
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  s_useDLMalloc = true;
  test1();
  t3.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  s_useDLMalloc = false;
  test1();
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_40.__r = (rep_conflict)std::chrono::operator-(&t3,&t2);
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_40);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_38);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2);
  poVar1 = std::operator<<(poVar1,",");
  local_50.__r = (rep_conflict)std::chrono::operator-(&local_30,&t3);
  local_48.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_50);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    std::chrono::high_resolution_clock::time_point t1 = std::chrono::high_resolution_clock::now();

    s_useDLMalloc = true;
    test1 ();

    std::chrono::high_resolution_clock::time_point t2 = std::chrono::high_resolution_clock::now();

    s_useDLMalloc = false;
    test1 ();

    std::chrono::high_resolution_clock::time_point t3 = std::chrono::high_resolution_clock::now();

    std::cout << std::chrono::duration_cast<std::chrono::duration<double>>(t2 - t1).count() << ","
              << std::chrono::duration_cast<std::chrono::duration<double>>(t3 - t2).count() << std::endl;
    return 0;
}